

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall spdlog::logger::~logger(logger *this)

{
  undefined8 *in_RDI;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__logger_0015ee10;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x106e3a);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

inline spdlog::logger::~logger() = default;